

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTiles
          (TiledRgbaOutputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int dx;
  int dy;
  lock_guard<std::mutex> lock;
  int in_stack_00000280;
  int in_stack_00000284;
  int in_stack_00000288;
  int in_stack_0000028c;
  ToYa *in_stack_00000290;
  int in_stack_000003dc;
  int in_stack_000003e0;
  int in_stack_000003e4;
  int in_stack_000003e8;
  int in_stack_000003ec;
  TiledOutputFile *in_stack_000003f0;
  int in_stack_00000400;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    TiledOutputFile::writeTiles
              (in_stack_000003f0,in_stack_000003ec,in_stack_000003e8,in_stack_000003e4,
               in_stack_000003e0,in_stack_000003dc,in_stack_00000400);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              (in_stack_ffffffffffffffb0,
               (mutex_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_2c = in_ECX; local_30 = in_ESI, local_2c <= in_R8D; local_2c = local_2c + 1) {
      for (; local_30 <= in_EDX; local_30 = local_30 + 1) {
        ToYa::writeTile(in_stack_00000290,in_stack_0000028c,in_stack_00000288,in_stack_00000284,
                        in_stack_00000280);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24ca32);
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTiles (
    int dxMin, int dxMax, int dyMin, int dyMax, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
                _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTiles (dxMin, dxMax, dyMin, dyMax, lx, ly); }
}